

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O3

int32_t __thiscall icu_63::RBBITableBuilder::getTableSize(RBBITableBuilder *this)

{
  int iVar1;
  int32_t iVar2;
  
  if (*this->fTree != (RBBINode *)0x0) {
    iVar1 = this->fDStates->count;
    iVar2 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
    return (iVar2 * 2 + 8) * iVar1 + 0x10;
  }
  return 0;
}

Assistant:

int32_t  RBBITableBuilder::getTableSize() const {
    int32_t    size = 0;
    int32_t    numRows;
    int32_t    numCols;
    int32_t    rowSize;

    if (fTree == NULL) {
        return 0;
    }

    size    = offsetof(RBBIStateTable, fTableData);    // The header, with no rows to the table.

    numRows = fDStates->size();
    numCols = fRB->fSetBuilder->getNumCharCategories();

    rowSize = offsetof(RBBIStateTableRow, fNextState) + sizeof(uint16_t)*numCols;
    size   += numRows * rowSize;
    return size;
}